

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O0

int64_t aom_highbd_sse_avx2(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  __m256i sum_4x64;
  __m256i sum_4x64_00;
  __m256i sum_4x64_01;
  __m256i sum_4x64_02;
  int iVar1;
  int in_ECX;
  long in_RDX;
  uint in_R8D;
  int in_R9D;
  int i_1;
  __m256i sum32_4;
  int l_3;
  uint16_t *b2;
  uint16_t *a2;
  __m256i sum32_3;
  int i;
  __m256i sum32_2;
  int l_2;
  __m256i sum32_1;
  int l_1;
  __m256i sum32;
  int l;
  __m256i sum;
  uint16_t *b;
  uint16_t *a;
  int64_t sse;
  int32_t y;
  bool local_2ac;
  bool local_2ab;
  bool local_2aa;
  bool local_2a9;
  int local_2a4;
  undefined8 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd80 [12];
  int in_stack_fffffffffffffd8c;
  long in_stack_fffffffffffffd90;
  uint16_t *in_stack_fffffffffffffda0;
  __m256i *in_stack_fffffffffffffda8;
  __m256i *sum_00;
  __m256i *in_stack_fffffffffffffdb0;
  __m256i *sum32_00;
  uint16_t *in_stack_fffffffffffffdb8;
  uint16_t *b_00;
  int in_stack_fffffffffffffdc4;
  uint16_t *in_stack_fffffffffffffdc8;
  __m256i *in_stack_fffffffffffffdd0;
  int local_224;
  __m256i *in_stack_fffffffffffffdf0;
  int local_1e4;
  undefined8 in_stack_fffffffffffffe30;
  uint16_t *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  uint16_t *in_stack_fffffffffffffe48;
  __m256i *in_stack_fffffffffffffe50;
  int local_1a4;
  int local_164;
  long local_140;
  int64_t local_130;
  int local_128;
  
  local_128 = 0;
  local_140 = in_RDX * 2;
  if (in_R8D == 4) {
    do {
      highbd_sse_w4x4_avx2
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      local_128 = local_128 + 4;
    } while (local_128 < in_R9D);
    local_130 = summary_all_avx2(in_stack_fffffffffffffdf0);
  }
  else if (in_R8D == 8) {
    do {
      highbd_sse_w8x2_avx2
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                 in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      local_128 = local_128 + 2;
    } while (local_128 < in_R9D);
    local_130 = summary_all_avx2(in_stack_fffffffffffffdf0);
  }
  else if (in_R8D == 0x10) {
    do {
      highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                          in_stack_fffffffffffffda0);
      local_128 = local_128 + 1;
    } while (local_128 < in_R9D);
    local_130 = summary_all_avx2(in_stack_fffffffffffffdf0);
  }
  else if (in_R8D == 0x20) {
    do {
      local_164 = 0;
      do {
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        local_164 = local_164 + 1;
        local_2a9 = local_164 < 0x40 && local_164 < in_R9D - local_128;
      } while (local_2a9);
      summary_32_avx2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_128 = local_128 + 0x40;
    } while (local_128 < in_R9D);
    sum_4x64._8_12_ = in_stack_fffffffffffffd80;
    sum_4x64[0] = in_stack_fffffffffffffd78;
    sum_4x64[2]._4_4_ = in_stack_fffffffffffffd8c;
    sum_4x64[3] = in_stack_fffffffffffffd90;
    local_130 = summary_4x64_avx2(sum_4x64);
  }
  else if (in_R8D == 0x40) {
    do {
      local_1a4 = 0;
      do {
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        local_1a4 = local_1a4 + 1;
        local_2aa = local_1a4 < 0x20 && local_1a4 < in_R9D - local_128;
      } while (local_2aa);
      summary_32_avx2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_128 = local_128 + 0x20;
    } while (local_128 < in_R9D);
    sum_4x64_00._8_12_ = in_stack_fffffffffffffd80;
    sum_4x64_00[0] = in_stack_fffffffffffffd78;
    sum_4x64_00[2]._4_4_ = in_stack_fffffffffffffd8c;
    sum_4x64_00[3] = in_stack_fffffffffffffd90;
    local_130 = summary_4x64_avx2(sum_4x64_00);
  }
  else if (in_R8D == 0x80) {
    do {
      local_1e4 = 0;
      do {
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        highbd_sse_w16_avx2(in_stack_fffffffffffffdb0,(uint16_t *)in_stack_fffffffffffffda8,
                            in_stack_fffffffffffffda0);
        local_1e4 = local_1e4 + 1;
        local_2ab = local_1e4 < 0x10 && local_1e4 < in_R9D - local_128;
      } while (local_2ab);
      summary_32_avx2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_128 = local_128 + 0x10;
    } while (local_128 < in_R9D);
    sum_4x64_01._8_12_ = in_stack_fffffffffffffd80;
    sum_4x64_01[0] = in_stack_fffffffffffffd78;
    sum_4x64_01[2]._4_4_ = in_stack_fffffffffffffd8c;
    sum_4x64_01[3] = in_stack_fffffffffffffd90;
    local_130 = summary_4x64_avx2(sum_4x64_01);
  }
  else {
    if ((in_R8D & 7) == 0) {
      do {
        in_stack_fffffffffffffd8c = 0;
        in_stack_fffffffffffffd78 = 0;
        do {
          local_2a4 = 0;
          do {
            highbd_sse_w8x2_avx2
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4
                       ,in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
            local_2a4 = local_2a4 + 8;
          } while (local_2a4 < (int)in_R8D);
          in_stack_fffffffffffffd8c = in_stack_fffffffffffffd8c + 2;
          local_2ac = in_stack_fffffffffffffd8c < 8 &&
                      in_stack_fffffffffffffd8c < in_R9D - local_128;
        } while (local_2ac);
        summary_32_avx2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        local_128 = local_128 + 8;
      } while (local_128 < in_R9D);
    }
    else {
      do {
        local_224 = 0;
        sum_00 = (__m256i *)0x0;
        sum32_00 = (__m256i *)0x0;
        b_00 = (uint16_t *)0x0;
        do {
          highbd_sse_w8x2_avx2
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                     b_00,(int)((ulong)sum32_00 >> 0x20));
          in_stack_fffffffffffffd90 = local_140 + (long)local_224 * 2 + (long)(in_ECX << 1) * 2;
          highbd_sse_w8x2_avx2
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                     b_00,(int)((ulong)sum32_00 >> 0x20));
          iVar1 = local_224 + 0xc;
          local_224 = local_224 + 8;
        } while (iVar1 < (int)in_R8D);
        highbd_sse_w4x4_avx2
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                   in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
        summary_32_avx2(sum32_00,sum_00);
        local_140 = local_140 + (long)(in_ECX << 2) * 2;
        local_128 = local_128 + 4;
      } while (local_128 < in_R9D);
    }
    sum_4x64_02._8_12_ = in_stack_fffffffffffffd80;
    sum_4x64_02[0] = in_stack_fffffffffffffd78;
    sum_4x64_02[2]._4_4_ = in_stack_fffffffffffffd8c;
    sum_4x64_02[3] = in_stack_fffffffffffffd90;
    local_130 = summary_4x64_avx2(sum_4x64_02);
  }
  return local_130;
}

Assistant:

int64_t aom_highbd_sse_avx2(const uint8_t *a8, int a_stride, const uint8_t *b8,
                            int b_stride, int width, int height) {
  int32_t y = 0;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  __m256i sum = _mm256_setzero_si256();
  switch (width) {
    case 4:
      do {
        highbd_sse_w4x4_avx2(&sum, a, a_stride, b, b_stride);
        a += a_stride << 2;
        b += b_stride << 2;
        y += 4;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 8:
      do {
        highbd_sse_w8x2_avx2(&sum, a, a_stride, b, b_stride);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 16:
      do {
        highbd_sse_w16_avx2(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 32:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16, b + 16);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 64 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 64;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    case 64:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16 * 1, b + 16 * 1);
          highbd_sse_w16_avx2(&sum32, a + 16 * 2, b + 16 * 2);
          highbd_sse_w16_avx2(&sum32, a + 16 * 3, b + 16 * 3);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 32 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 32;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    case 128:
      do {
        int l = 0;
        __m256i sum32 = _mm256_setzero_si256();
        do {
          highbd_sse_w16_avx2(&sum32, a, b);
          highbd_sse_w16_avx2(&sum32, a + 16 * 1, b + 16 * 1);
          highbd_sse_w16_avx2(&sum32, a + 16 * 2, b + 16 * 2);
          highbd_sse_w16_avx2(&sum32, a + 16 * 3, b + 16 * 3);
          highbd_sse_w16_avx2(&sum32, a + 16 * 4, b + 16 * 4);
          highbd_sse_w16_avx2(&sum32, a + 16 * 5, b + 16 * 5);
          highbd_sse_w16_avx2(&sum32, a + 16 * 6, b + 16 * 6);
          highbd_sse_w16_avx2(&sum32, a + 16 * 7, b + 16 * 7);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 16 && l < (height - y));
        summary_32_avx2(&sum32, &sum);
        y += 16;
      } while (y < height);
      sse = summary_4x64_avx2(sum);
      break;
    default:
      if (width & 0x7) {
        do {
          int i = 0;
          __m256i sum32 = _mm256_setzero_si256();
          do {
            highbd_sse_w8x2_avx2(&sum32, a + i, a_stride, b + i, b_stride);
            const uint16_t *a2 = a + i + (a_stride << 1);
            const uint16_t *b2 = b + i + (b_stride << 1);
            highbd_sse_w8x2_avx2(&sum32, a2, a_stride, b2, b_stride);
            i += 8;
          } while (i + 4 < width);
          highbd_sse_w4x4_avx2(&sum32, a + i, a_stride, b + i, b_stride);
          summary_32_avx2(&sum32, &sum);
          a += a_stride << 2;
          b += b_stride << 2;
          y += 4;
        } while (y < height);
      } else {
        do {
          int l = 0;
          __m256i sum32 = _mm256_setzero_si256();
          do {
            int i = 0;
            do {
              highbd_sse_w8x2_avx2(&sum32, a + i, a_stride, b + i, b_stride);
              i += 8;
            } while (i < width);
            a += a_stride << 1;
            b += b_stride << 1;
            l += 2;
          } while (l < 8 && l < (height - y));
          summary_32_avx2(&sum32, &sum);
          y += 8;
        } while (y < height);
      }
      sse = summary_4x64_avx2(sum);
      break;
  }
  return sse;
}